

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SequentialPropsCmd.cpp
# Opt level: O2

int cmdline_parser_internal
              (int argc,char **argv,gengetopt_args_info *args_info,cmdline_parser_params *params,
              char *additional_error)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  char *long_opt;
  ulong uVar4;
  custom_getopt_data *pcVar5;
  long lVar6;
  void *pvVar7;
  size_t sVar8;
  char **ppcVar9;
  uint *prev_given;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  uint *field_given;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  uint uVar10;
  uint uVar11;
  option *poVar12;
  option *poVar13;
  custom_getopt_data *pcVar14;
  custom_getopt_data *d;
  char *pcVar15;
  char **possible_values;
  char cVar16;
  size_t sVar17;
  char *pcVar18;
  int iVar19;
  ulong uVar20;
  option *poVar21;
  char *pcVar22;
  cmdline_parser_arg_type arg_type;
  int iVar23;
  undefined4 in_stack_fffffffffffffb38;
  int iVar24;
  int local_4b4;
  gengetopt_args_info local_args_info;
  
  package_name = *argv;
  long_opt = (char *)(ulong)(uint)params->override;
  iVar3 = params->check_required;
  uVar4 = (ulong)(uint)params->check_ambiguity;
  pcVar15 = (char *)argv;
  if (params->initialize != 0) {
    cmdline_parser_init(args_info);
  }
  cmdline_parser_init(&local_args_info);
  pcVar5 = (custom_getopt_data *)(ulong)(uint)argc;
  pcVar18 = (char *)0x0;
  pcVar14 = (custom_getopt_data *)0x0;
  pcVar22 = extraout_RDX;
  iVar24 = params->print_errors;
LAB_0012392b:
  custom_opterr = iVar24;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = (uint)pcVar14;
  uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  if (argc < 1) goto LAB_00124671;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = (char *)0x0;
  custom_optarg = pcVar18;
  iVar24 = custom_opterr;
  if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) ||
     ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 & 1) == 0)) {
    if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 == 0) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = 1;
    }
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_4 = 1;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
         _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
         _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
LAB_001239b7:
    if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
        (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    if ((int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 <
        (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    pcVar22 = (char *)CONCAT71((int7)((ulong)pcVar22 >> 8),
                               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
                               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
                               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
                               _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7);
    if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 ==
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 ||
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 ==
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 !=
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 =
             _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
    }
    else {
      exchange(argv,(custom_getopt_data *)pcVar15);
      pcVar22 = extraout_RDX_00;
    }
    pcVar14 = (custom_getopt_data *)(long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    uVar10 = argc;
    if (argc < (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
      uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    }
    d = pcVar5;
    if ((long)pcVar5 < (long)pcVar14) {
      d = pcVar14;
    }
    for (; _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = uVar10,
        (long)pcVar14 < (long)pcVar5;
        pcVar14 = (custom_getopt_data *)((long)&pcVar14->custom_optind + 1)) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = (uint)pcVar14;
      if ((*argv[(long)pcVar14] == '-') && (argv[(long)pcVar14][1] != '\0')) {
        d = (custom_getopt_data *)((ulong)pcVar14 & 0xffffffff);
        break;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
    }
    uVar11 = argc;
    if ((((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 == argc) ||
         (pcVar15 = argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7],
         uVar11 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7, *pcVar15 != '-')) ||
        (pcVar15[1] != '-')) || (pcVar15[2] != '\0')) {
      iVar19 = (int)d;
      if (iVar19 != argc) {
        lVar6 = (long)iVar19;
        pcVar15 = argv[lVar6];
        if ((*pcVar15 != '-') || (pcVar15[1] == '\0')) {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = iVar19 + 1;
          uVar20 = 1;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
          goto switchD_00123f91_caseD_64;
        }
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 =
             pcVar15 + (ulong)(pcVar15[1] == '-') + 1;
        goto LAB_00123aa6;
      }
    }
    else {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 + 1;
      uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 !=
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7) {
        exchange(argv,d);
        pcVar22 = extraout_RDX_06;
        uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 = uVar10;
      pcVar14 = (custom_getopt_data *)(ulong)(uint)argc;
      uVar11 = argc;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = argc;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_7 = argc;
    }
    uVar10 = (uint)pcVar14;
    if (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6 != uVar11) {
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 =
           _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
      uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_6;
    }
    goto LAB_00124671;
  }
  if ((_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == (char *)0x0) ||
     (*_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 == '\0')) goto LAB_001239b7;
  lVar6 = (long)(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  d = (custom_getopt_data *)((ulong)pcVar14 & 0xffffffff);
LAB_00123aa6:
  pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
  pcVar15 = argv[lVar6];
  uVar10 = (uint)d;
  if (pcVar15[1] == '-') {
    for (sVar17 = 0;
        (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar17] != '\0' &&
        (_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5[sVar17] != '=')); sVar17 = sVar17 + 1)
    {
    }
    bVar1 = false;
    local_4b4 = -1;
    iVar19 = 0;
    poVar12 = (option *)0x0;
    for (poVar21 = cmdline_parser_internal::long_options; pcVar22 = poVar21->name,
        pcVar22 != (char *)0x0; poVar21 = poVar21 + 1) {
      iVar2 = strncmp(pcVar22,pcVar18,sVar17);
      poVar13 = poVar12;
      iVar23 = local_4b4;
      if (iVar2 == 0) {
        sVar8 = strlen(pcVar22);
        if ((int)sVar8 == (int)sVar17) goto LAB_00123c1e;
        poVar13 = poVar21;
        iVar23 = iVar19;
        if ((poVar12 != (option *)0x0) &&
           (((poVar12->has_arg != poVar21->has_arg || (poVar12->flag != poVar21->flag)) ||
            (poVar13 = poVar12, iVar23 = local_4b4, poVar12->val != poVar21->val)))) {
          bVar1 = true;
          poVar13 = poVar12;
          iVar23 = local_4b4;
        }
      }
      local_4b4 = iVar23;
      iVar19 = iVar19 + 1;
      poVar12 = poVar13;
    }
    if (bVar1) {
      if (iVar24 != 0) {
        fprintf(_stderr,"%s: option `%s\' is ambiguous\n",*argv,pcVar15);
        pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
        uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      sVar17 = strlen(pcVar18);
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + sVar17;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
    }
    else {
      poVar21 = poVar12;
      iVar19 = local_4b4;
      if (poVar12 != (option *)0x0) {
LAB_00123c1e:
        local_4b4 = iVar19;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
        pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        if (pcVar18[sVar17] == '\0') {
          if (poVar21->has_arg == 1) {
            if (argc <= (int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0) {
              if (iVar24 != 0) {
                fprintf(_stderr,"%s: option `%s\' requires an argument\n",*argv,pcVar15);
                pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
              }
              sVar17 = strlen(pcVar18);
              _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + sVar17;
              goto LAB_00124618;
            }
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 =
                 argv[(int)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0];
            pcVar14 = (custom_getopt_data *)(ulong)(uVar10 + 2);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 2;
          }
        }
        else {
          if (poVar21->has_arg == 0) {
            if (iVar24 != 0) {
              if (pcVar15[1] == '-') {
                fprintf(_stderr,"%s: option `--%s\' doesn\'t allow an argument\n",*argv,
                        poVar21->name);
              }
              else {
                fprintf(_stderr,"%s: option `%c%s\' doesn\'t allow an argument\n",*argv,
                        (ulong)(uint)(int)*pcVar15,poVar21->name);
              }
            }
            pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
            sVar17 = strlen(_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5);
            _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar15 + sVar17;
            goto LAB_00124618;
          }
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar18 + sVar17 + 1;
        }
        sVar17 = strlen(pcVar18);
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar18 + sVar17;
        uVar20 = (ulong)(uint)poVar21->val;
        pcVar22 = extraout_RDX_02;
        if ((uint *)poVar21->flag == (uint *)0x0) goto LAB_00123f6c;
        *poVar21->flag = poVar21->val;
        pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        iVar24 = custom_opterr;
        goto LAB_00123cbc;
      }
      if (iVar24 != 0) {
        fprintf(_stderr,"%s: unrecognized option `--%s\'\n",*argv,pcVar18);
        uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = "";
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
    }
LAB_00124618:
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    goto LAB_00124626;
  }
  pcVar15 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 + 1;
  cVar16 = *_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5;
  uVar11 = (uint)cVar16;
  uVar20 = (ulong)uVar11;
  _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = pcVar15;
  pvVar7 = memchr("hVi:o:b:x:y:z:r:cvt",uVar11,0x14);
  if (pcVar18[1] == '\0') {
    _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
    pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
    uVar10 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
  }
  if ((pvVar7 == (void *)0x0) || (cVar16 == ':')) {
    if (iVar24 != 0) {
      fprintf(_stderr,"%s: invalid option -- %c\n",*argv,uVar20);
    }
    goto LAB_00124618;
  }
  pcVar22 = extraout_RDX_01;
  if (*(char *)((long)pvVar7 + 1) == ':') {
    if (*(char *)((long)pvVar7 + 2) == ':') {
      if (*pcVar15 == '\0') {
        pcVar15 = (char *)0x0;
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
        pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
      }
      local_4b4 = 0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
    }
    else {
      if (*pcVar15 == '\0') {
        if (uVar10 == argc) {
          cVar16 = '?';
          if (iVar24 == 0) {
            iVar24 = 0;
          }
          else {
            fprintf(_stderr,"%s: option requires an argument -- %c\n",*argv,(ulong)uVar11);
            pcVar14 = (custom_getopt_data *)
                      (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
            pcVar22 = extraout_RDX_05;
            iVar24 = custom_opterr;
          }
        }
        else {
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
          pcVar14 = (custom_getopt_data *)
                    (ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
          _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = argv[(int)uVar10];
        }
      }
      else {
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0 = uVar10 + 1;
        pcVar14 = (custom_getopt_data *)(ulong)_ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_0;
        _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3 = pcVar15;
      }
      local_4b4 = 0;
      _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_5 = (char *)0x0;
      uVar20 = (ulong)(uint)(int)cVar16;
    }
  }
  else {
    local_4b4 = 0;
  }
LAB_00123f6c:
  pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
  custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
  iVar19 = (int)uVar20;
  iVar23 = (int)long_opt;
  switch(iVar19) {
  case 0x62:
    iVar19 = 0x62;
    iVar23 = 0x1cd2b7;
    prev_given = &local_args_info.nbins_given;
    field_given = &args_info->nbins_given;
    pcVar15 = (char *)&args_info->nbins_orig;
    ppcVar9 = (char **)&args_info->nbins_arg;
LAB_00123fc3:
    possible_values = (char **)0x0;
    arg_type = ARG_INT;
    pcVar22 = "100";
    goto LAB_00124260;
  case 99:
    iVar19 = args_info->sequentialProps_group_counter;
    if (iVar19 != 0 && iVar23 != 0) {
      args_info->ca1_given = 0;
      args_info->ca2_given = 0;
      args_info->gcn_given = 0;
      args_info->testequi_given = 0;
      args_info->com_given = 0;
      args_info->comvel_given = 0;
      args_info->deltaCount_given = 0;
      args_info->fluxOut_given = 0;
      iVar19 = 0;
    }
    args_info->sequentialProps_group_counter = iVar19 + 1;
    iVar19 = 99;
    iVar23 = 0x1cc021;
    prev_given = &local_args_info.com_given;
    field_given = &args_info->com_given;
    goto LAB_00124217;
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x70:
  case 0x71:
  case 0x73:
  case 0x75:
  case 0x77:
switchD_00123f91_caseD_64:
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    fprintf(_stderr,"%s: option unknown: %c%s\n","SequentialProps",uVar20,"");
    abort();
  case 0x68:
    cmdline_parser_print_help();
LAB_0012486a:
    cmdline_parser_free(&local_args_info);
    exit(0);
  case 0x69:
    iVar19 = 0x69;
    iVar23 = 0x1cd29e;
    prev_given = &local_args_info.input_given;
    field_given = &args_info->input_given;
    pcVar15 = (char *)&args_info->input_orig;
    ppcVar9 = &args_info->input_arg;
    goto LAB_00124254;
  case 0x6f:
    iVar19 = 0x6f;
    iVar23 = 0x1cd2a4;
    prev_given = &local_args_info.output_given;
    field_given = &args_info->output_given;
    pcVar15 = (char *)&args_info->output_orig;
    ppcVar9 = &args_info->output_arg;
    goto LAB_00124254;
  case 0x72:
    iVar19 = 0x72;
    iVar23 = 0x1cd2f3;
    prev_given = &local_args_info.dropletR_given;
    field_given = &args_info->dropletR_given;
    pcVar15 = (char *)&args_info->dropletR_orig;
    ppcVar9 = (char **)&args_info->dropletR_arg;
    break;
  case 0x74:
    iVar19 = args_info->sequentialProps_group_counter;
    if (iVar19 != 0 && iVar23 != 0) {
      args_info->ca1_given = 0;
      args_info->ca2_given = 0;
      args_info->gcn_given = 0;
      args_info->testequi_given = 0;
      args_info->com_given = 0;
      args_info->comvel_given = 0;
      args_info->deltaCount_given = 0;
      args_info->fluxOut_given = 0;
      iVar19 = 0;
    }
    args_info->sequentialProps_group_counter = iVar19 + 1;
    iVar19 = 0x74;
    iVar23 = 0x1cd32f;
    prev_given = &local_args_info.testequi_given;
    field_given = &args_info->testequi_given;
    goto LAB_00124217;
  case 0x76:
    iVar19 = args_info->sequentialProps_group_counter;
    if (iVar19 != 0 && iVar23 != 0) {
      args_info->ca1_given = 0;
      args_info->ca2_given = 0;
      args_info->gcn_given = 0;
      args_info->testequi_given = 0;
      args_info->com_given = 0;
      args_info->comvel_given = 0;
      args_info->deltaCount_given = 0;
      args_info->fluxOut_given = 0;
      iVar19 = 0;
    }
    args_info->sequentialProps_group_counter = iVar19 + 1;
    iVar19 = 0x76;
    iVar23 = 0x1cd319;
    prev_given = &local_args_info.comvel_given;
    field_given = &args_info->comvel_given;
LAB_00124217:
    ppcVar9 = (char **)0x0;
    pcVar15 = (char *)0x0;
    arg_type = ARG_NO;
    goto LAB_0012425e;
  case 0x78:
    iVar19 = 0x78;
    iVar23 = 0x1cd2d4;
    prev_given = &local_args_info.centroidX_given;
    field_given = &args_info->centroidX_given;
    pcVar15 = (char *)&args_info->centroidX_orig;
    ppcVar9 = (char **)&args_info->centroidX_arg;
    break;
  case 0x79:
    iVar19 = 0x79;
    iVar23 = 0x1cd2de;
    prev_given = &local_args_info.centroidY_given;
    field_given = &args_info->centroidY_given;
    pcVar15 = (char *)&args_info->centroidY_orig;
    ppcVar9 = (char **)&args_info->centroidY_arg;
    break;
  case 0x7a:
    iVar19 = 0x7a;
    iVar23 = 0x1cd2e8;
    prev_given = &local_args_info.referenceZ_given;
    field_given = &args_info->referenceZ_given;
    pcVar15 = (char *)&args_info->referenceZ_orig;
    ppcVar9 = (char **)&args_info->referenceZ_arg;
    break;
  default:
    if (iVar19 != 0) {
      uVar10 = (uint)pcVar14;
      if (iVar19 == -1) {
LAB_00124671:
        uVar11 = args_info->sequentialProps_group_counter;
        custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
        if (1 < (int)uVar11) {
          fprintf(_stderr,"%s: %d options of group sequentialProps were given. One is required%s.\n"
                  ,*argv,(ulong)uVar11,"");
          pcVar22 = extraout_RDX_07;
        }
        uVar11 = (uint)(1 < (int)uVar11);
        if (iVar3 != 0) {
          iVar3 = cmdline_parser_required2(args_info,*argv,pcVar22);
          uVar11 = uVar11 + iVar3;
        }
        cmdline_parser_release(&local_args_info);
        if (uVar11 != 0) {
          return 1;
        }
        uVar11 = argc - uVar10;
        if (uVar11 != 0 && (int)uVar10 <= argc) {
          args_info->inputs_num = uVar11;
          ppcVar9 = (char **)malloc((ulong)uVar11 << 3);
          args_info->inputs = ppcVar9;
          for (lVar6 = 0; (int)uVar10 + lVar6 < (long)argc; lVar6 = lVar6 + 1) {
            pcVar15 = gengetopt_strdup(argv[(int)uVar10 + lVar6]);
            args_info->inputs[lVar6] = pcVar15;
          }
          return 0;
        }
        return 0;
      }
      if (iVar19 != 0x3f) {
        if (iVar19 == 0x56) {
          cmdline_parser_print_version();
          goto LAB_0012486a;
        }
        goto switchD_00123f91_caseD_64;
      }
      goto LAB_00124626;
    }
LAB_00123cbc:
    pcVar18 = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    pcVar22 = cmdline_parser_internal::long_options[local_4b4].name;
    iVar23 = 0x1cd2ab;
    custom_optarg = _ZZL22custom_getopt_internaliPKPcPKcPK6optionPiE1d_3;
    iVar19 = strcmp(pcVar22,"sele1");
    prev_given = &local_args_info.sele1_given;
    field_given = &args_info->sele1_given;
    pcVar15 = (char *)&args_info->sele1_orig;
    ppcVar9 = &args_info->sele1_arg;
    if (iVar19 != 0) {
      iVar23 = 0x1cd2b1;
      iVar19 = strcmp(pcVar22,"sele2");
      prev_given = &local_args_info.sele2_given;
      field_given = &args_info->sele2_given;
      pcVar15 = (char *)&args_info->sele2_orig;
      ppcVar9 = &args_info->sele2_arg;
      if (iVar19 != 0) {
        iVar19 = strcmp(pcVar22,"nbins_z");
        if (iVar19 == 0) {
          iVar19 = 0x2d;
          iVar23 = 0x1cd2bd;
          prev_given = &local_args_info.nbins_z_given;
          field_given = &args_info->nbins_z_given;
          pcVar15 = (char *)&args_info->nbins_z_orig;
          ppcVar9 = (char **)&args_info->nbins_z_arg;
          goto LAB_00123fc3;
        }
        iVar19 = strcmp(pcVar22,"privilegedAxis");
        if (iVar19 == 0) {
          possible_values = cmdline_parser_privilegedAxis_values;
          iVar19 = 0x2d;
          iVar23 = 0x1cd2c5;
          arg_type = ARG_ENUM;
          pcVar22 = "z";
          prev_given = &local_args_info.privilegedAxis_given;
          field_given = &args_info->privilegedAxis_given;
          pcVar15 = (char *)&args_info->privilegedAxis_orig;
          ppcVar9 = (char **)&args_info->privilegedAxis_arg;
          goto LAB_00124260;
        }
        iVar23 = 0x1cd2fc;
        iVar19 = strcmp(pcVar22,"threshDens");
        prev_given = &local_args_info.threshDens_given;
        field_given = &args_info->threshDens_given;
        pcVar15 = (char *)&args_info->threshDens_orig;
        ppcVar9 = (char **)&args_info->threshDens_arg;
        if (iVar19 != 0) {
          iVar23 = 0x1cd307;
          iVar19 = strcmp(pcVar22,"bufferLength");
          prev_given = &local_args_info.bufferLength_given;
          field_given = &args_info->bufferLength_given;
          pcVar15 = (char *)&args_info->bufferLength_orig;
          ppcVar9 = (char **)&args_info->bufferLength_arg;
          if (iVar19 != 0) {
            iVar23 = 0x1cd314;
            iVar19 = strcmp(pcVar22,"rcut");
            prev_given = &local_args_info.rcut_given;
            field_given = &args_info->rcut_given;
            pcVar15 = (char *)&args_info->rcut_orig;
            ppcVar9 = (char **)&args_info->rcut_arg;
            if (iVar19 != 0) {
              iVar19 = strcmp(pcVar22,"deltaCount");
              if (iVar19 == 0) {
                iVar19 = args_info->sequentialProps_group_counter;
                if (iVar19 != 0 && (int)long_opt != 0) {
                  args_info->ca1_given = 0;
                  args_info->ca2_given = 0;
                  args_info->gcn_given = 0;
                  args_info->testequi_given = 0;
                  args_info->com_given = 0;
                  args_info->comvel_given = 0;
                  args_info->deltaCount_given = 0;
                  args_info->fluxOut_given = 0;
                  iVar19 = 0;
                }
                args_info->sequentialProps_group_counter = iVar19 + 1;
                iVar19 = 0x2d;
                iVar23 = 0x1cd320;
                prev_given = &local_args_info.deltaCount_given;
                field_given = &args_info->deltaCount_given;
              }
              else {
                iVar19 = strcmp(pcVar22,"fluxOut");
                if (iVar19 == 0) {
                  iVar19 = args_info->sequentialProps_group_counter;
                  if (iVar19 != 0 && (int)long_opt != 0) {
                    args_info->ca1_given = 0;
                    args_info->ca2_given = 0;
                    args_info->gcn_given = 0;
                    args_info->testequi_given = 0;
                    args_info->com_given = 0;
                    args_info->comvel_given = 0;
                    args_info->deltaCount_given = 0;
                    args_info->fluxOut_given = 0;
                    iVar19 = 0;
                  }
                  args_info->sequentialProps_group_counter = iVar19 + 1;
                  iVar19 = 0x2d;
                  iVar23 = 0x1cc54c;
                  prev_given = &local_args_info.fluxOut_given;
                  field_given = &args_info->fluxOut_given;
                }
                else {
                  iVar19 = strcmp(pcVar22,"ca1");
                  if (iVar19 == 0) {
                    iVar19 = args_info->sequentialProps_group_counter;
                    if (iVar19 != 0 && (int)long_opt != 0) {
                      args_info->ca1_given = 0;
                      args_info->ca2_given = 0;
                      args_info->gcn_given = 0;
                      args_info->testequi_given = 0;
                      args_info->com_given = 0;
                      args_info->comvel_given = 0;
                      args_info->deltaCount_given = 0;
                      args_info->fluxOut_given = 0;
                      iVar19 = 0;
                    }
                    args_info->sequentialProps_group_counter = iVar19 + 1;
                    iVar19 = 0x2d;
                    iVar23 = 0x1cc351;
                    prev_given = &local_args_info.ca1_given;
                    field_given = &args_info->ca1_given;
                  }
                  else {
                    iVar19 = strcmp(pcVar22,"ca2");
                    if (iVar19 == 0) {
                      iVar19 = args_info->sequentialProps_group_counter;
                      if (iVar19 != 0 && (int)long_opt != 0) {
                        args_info->ca1_given = 0;
                        args_info->ca2_given = 0;
                        args_info->gcn_given = 0;
                        args_info->testequi_given = 0;
                        args_info->com_given = 0;
                        args_info->comvel_given = 0;
                        args_info->deltaCount_given = 0;
                        args_info->fluxOut_given = 0;
                        iVar19 = 0;
                      }
                      args_info->sequentialProps_group_counter = iVar19 + 1;
                      iVar19 = 0x2d;
                      iVar23 = 0x1cc4b9;
                      prev_given = &local_args_info.ca2_given;
                      field_given = &args_info->ca2_given;
                      goto LAB_00124217;
                    }
                    pcVar15 = "gcn";
                    iVar19 = strcmp(pcVar22,"gcn");
                    pcVar22 = extraout_RDX_03;
                    if (iVar19 != 0) goto LAB_0012392b;
                    iVar19 = args_info->sequentialProps_group_counter;
                    if (iVar19 != 0 && (int)long_opt != 0) {
                      args_info->ca1_given = 0;
                      args_info->ca2_given = 0;
                      args_info->gcn_given = 0;
                      args_info->testequi_given = 0;
                      args_info->com_given = 0;
                      args_info->comvel_given = 0;
                      args_info->deltaCount_given = 0;
                      args_info->fluxOut_given = 0;
                      iVar19 = 0;
                    }
                    args_info->sequentialProps_group_counter = iVar19 + 1;
                    iVar19 = 0x2d;
                    iVar23 = 0x1cd32b;
                    prev_given = &local_args_info.gcn_given;
                    field_given = &args_info->gcn_given;
                  }
                }
              }
              goto LAB_00124217;
            }
          }
        }
        iVar19 = 0x2d;
        break;
      }
    }
    iVar19 = 0x2d;
LAB_00124254:
    arg_type = ARG_STRING;
    goto LAB_0012425e;
  }
  arg_type = ARG_DOUBLE;
LAB_0012425e:
  possible_values = (char **)0x0;
  pcVar22 = (char *)0x0;
LAB_00124260:
  iVar19 = update_arg(ppcVar9,(char **)pcVar15,field_given,prev_given,pcVar18,possible_values,
                      pcVar22,arg_type,(int)uVar4,(int)long_opt,iVar23,iVar19,long_opt,(char)uVar4,
                      (char *)CONCAT44(iVar24,in_stack_fffffffffffffb38));
  pcVar22 = extraout_RDX_04;
  if (iVar19 != 0) {
LAB_00124626:
    cmdline_parser_release(&local_args_info);
    return 1;
  }
  goto LAB_0012392b;
}

Assistant:

int
cmdline_parser_internal (
  int argc, char **argv, struct gengetopt_args_info *args_info,
                        struct cmdline_parser_params *params, const char *additional_error)
{
  int c;	/* Character of the parsed option.  */

  int error_occurred = 0;
  struct gengetopt_args_info local_args_info;
  
  int override;
  int initialize;
  int check_required;
  int check_ambiguity;

  char *optarg;
  int optind;
  int opterr;
  int optopt;
  
  package_name = argv[0];
  
  /* TODO: Why is this here? It is not used anywhere. */
  override = params->override;
  FIX_UNUSED(override);

  initialize = params->initialize;
  check_required = params->check_required;

  /* TODO: Why is this here? It is not used anywhere. */
  check_ambiguity = params->check_ambiguity;
  FIX_UNUSED(check_ambiguity);

  if (initialize)
    cmdline_parser_init (args_info);

  cmdline_parser_init (&local_args_info);

  optarg = 0;
  optind = 0;
  opterr = params->print_errors;
  optopt = '?';

  while (1)
    {
      int option_index = 0;

      static struct option long_options[] = {
        { "help",	0, NULL, 'h' },
        { "version",	0, NULL, 'V' },
        { "input",	1, NULL, 'i' },
        { "output",	1, NULL, 'o' },
        { "sele1",	1, NULL, 0 },
        { "sele2",	1, NULL, 0 },
        { "nbins",	1, NULL, 'b' },
        { "nbins_z",	1, NULL, 0 },
        { "privilegedAxis",	1, NULL, 0 },
        { "centroidX",	1, NULL, 'x' },
        { "centroidY",	1, NULL, 'y' },
        { "referenceZ",	1, NULL, 'z' },
        { "dropletR",	1, NULL, 'r' },
        { "threshDens",	1, NULL, 0 },
        { "bufferLength",	1, NULL, 0 },
        { "rcut",	1, NULL, 0 },
        { "com",	0, NULL, 'c' },
        { "comvel",	0, NULL, 'v' },
        { "deltaCount",	0, NULL, 0 },
        { "fluxOut",	0, NULL, 0 },
        { "ca1",	0, NULL, 0 },
        { "ca2",	0, NULL, 0 },
        { "gcn",	0, NULL, 0 },
        { "testequi",	0, NULL, 't' },
        { 0,  0, 0, 0 }
      };

      custom_optarg = optarg;
      custom_optind = optind;
      custom_opterr = opterr;
      custom_optopt = optopt;

      c = custom_getopt_long (argc, argv, "hVi:o:b:x:y:z:r:cvt", long_options, &option_index);

      optarg = custom_optarg;
      optind = custom_optind;
      opterr = custom_opterr;
      optopt = custom_optopt;

      if (c == -1) break;	/* Exit from `while (1)' loop.  */

      switch (c)
        {
        case 'h':	/* Print help and exit.  */
          cmdline_parser_print_help ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'V':	/* Print version and exit.  */
          cmdline_parser_print_version ();
          cmdline_parser_free (&local_args_info);
          exit (EXIT_SUCCESS);

        case 'i':	/* input dump file.  */
        
        
          if (update_arg( (void *)&(args_info->input_arg), 
               &(args_info->input_orig), &(args_info->input_given),
              &(local_args_info.input_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "input", 'i',
              additional_error))
            goto failure;
        
          break;
        case 'o':	/* output file name.  */
        
        
          if (update_arg( (void *)&(args_info->output_arg), 
               &(args_info->output_orig), &(args_info->output_given),
              &(local_args_info.output_given), optarg, 0, 0, ARG_STRING,
              check_ambiguity, override, 0, 0,
              "output", 'o',
              additional_error))
            goto failure;
        
          break;
        case 'b':	/* number of bins (general purpose).  */
        
        
          if (update_arg( (void *)&(args_info->nbins_arg), 
               &(args_info->nbins_orig), &(args_info->nbins_given),
              &(local_args_info.nbins_given), optarg, 0, "100", ARG_INT,
              check_ambiguity, override, 0, 0,
              "nbins", 'b',
              additional_error))
            goto failure;
        
          break;
        case 'x':	/* Location of droplet centroid in x.  */
        
        
          if (update_arg( (void *)&(args_info->centroidX_arg), 
               &(args_info->centroidX_orig), &(args_info->centroidX_given),
              &(local_args_info.centroidX_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidX", 'x',
              additional_error))
            goto failure;
        
          break;
        case 'y':	/* Location of droplet centroid in y.  */
        
        
          if (update_arg( (void *)&(args_info->centroidY_arg), 
               &(args_info->centroidY_orig), &(args_info->centroidY_given),
              &(local_args_info.centroidY_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "centroidY", 'y',
              additional_error))
            goto failure;
        
          break;
        case 'z':	/* Reference z-height of solid surface.  */
        
        
          if (update_arg( (void *)&(args_info->referenceZ_arg), 
               &(args_info->referenceZ_orig), &(args_info->referenceZ_given),
              &(local_args_info.referenceZ_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "referenceZ", 'z',
              additional_error))
            goto failure;
        
          break;
        case 'r':	/* Droplet radius in angstroms.  */
        
        
          if (update_arg( (void *)&(args_info->dropletR_arg), 
               &(args_info->dropletR_orig), &(args_info->dropletR_given),
              &(local_args_info.dropletR_given), optarg, 0, 0, ARG_DOUBLE,
              check_ambiguity, override, 0, 0,
              "dropletR", 'r',
              additional_error))
            goto failure;
        
          break;
        case 'c':	/* selection center of mass.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->com_given),
              &(local_args_info.com_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "com", 'c',
              additional_error))
            goto failure;
        
          break;
        case 'v':	/* selection center of mass velocity.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->comvel_given),
              &(local_args_info.comvel_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "comvel", 'v',
              additional_error))
            goto failure;
        
          break;
        case 't':	/* Temperature using all componets of linear and angular momentum.  */
        
          if (args_info->sequentialProps_group_counter && override)
            reset_group_sequentialProps (args_info);
          args_info->sequentialProps_group_counter += 1;
        
          if (update_arg( 0 , 
               0 , &(args_info->testequi_given),
              &(local_args_info.testequi_given), optarg, 0, 0, ARG_NO,
              check_ambiguity, override, 0, 0,
              "testequi", 't',
              additional_error))
            goto failure;
        
          break;

        case 0:	/* Long option with no short option */
          /* select first stuntdouble set.  */
          if (strcmp (long_options[option_index].name, "sele1") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele1_arg), 
                 &(args_info->sele1_orig), &(args_info->sele1_given),
                &(local_args_info.sele1_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele1", '-',
                additional_error))
              goto failure;
          
          }
          /* select second stuntdouble set (if sele2 is not set, use script from sele1).  */
          else if (strcmp (long_options[option_index].name, "sele2") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->sele2_arg), 
                 &(args_info->sele2_orig), &(args_info->sele2_given),
                &(local_args_info.sele2_given), optarg, 0, 0, ARG_STRING,
                check_ambiguity, override, 0, 0,
                "sele2", '-',
                additional_error))
              goto failure;
          
          }
          /* number of bins in z axis.  */
          else if (strcmp (long_options[option_index].name, "nbins_z") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->nbins_z_arg), 
                 &(args_info->nbins_z_orig), &(args_info->nbins_z_given),
                &(local_args_info.nbins_z_given), optarg, 0, "100", ARG_INT,
                check_ambiguity, override, 0, 0,
                "nbins_z", '-',
                additional_error))
              goto failure;
          
          }
          /* which axis is special for spatial analysis (default = z axis).  */
          else if (strcmp (long_options[option_index].name, "privilegedAxis") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->privilegedAxis_arg), 
                 &(args_info->privilegedAxis_orig), &(args_info->privilegedAxis_given),
                &(local_args_info.privilegedAxis_given), optarg, cmdline_parser_privilegedAxis_values, "z", ARG_ENUM,
                check_ambiguity, override, 0, 0,
                "privilegedAxis", '-',
                additional_error))
              goto failure;
          
          }
          /* Threshold Density in g/cm^3.  */
          else if (strcmp (long_options[option_index].name, "threshDens") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->threshDens_arg), 
                 &(args_info->threshDens_orig), &(args_info->threshDens_given),
                &(local_args_info.threshDens_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "threshDens", '-',
                additional_error))
              goto failure;
          
          }
          /* Buffer length in angstroms.  */
          else if (strcmp (long_options[option_index].name, "bufferLength") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->bufferLength_arg), 
                 &(args_info->bufferLength_orig), &(args_info->bufferLength_given),
                &(local_args_info.bufferLength_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "bufferLength", '-',
                additional_error))
              goto failure;
          
          }
          /* cutoff radius (rcut).  */
          else if (strcmp (long_options[option_index].name, "rcut") == 0)
          {
          
          
            if (update_arg( (void *)&(args_info->rcut_arg), 
                 &(args_info->rcut_orig), &(args_info->rcut_given),
                &(local_args_info.rcut_given), optarg, 0, 0, ARG_DOUBLE,
                check_ambiguity, override, 0, 0,
                "rcut", '-',
                additional_error))
              goto failure;
          
          }
          /* difference in counts between two selections.  */
          else if (strcmp (long_options[option_index].name, "deltaCount") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->deltaCount_given),
                &(local_args_info.deltaCount_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "deltaCount", '-',
                additional_error))
              goto failure;
          
          }
          /* number flux out of a selection.  */
          else if (strcmp (long_options[option_index].name, "fluxOut") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->fluxOut_given),
                &(local_args_info.fluxOut_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "fluxOut", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using center of mass).  */
          else if (strcmp (long_options[option_index].name, "ca1") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca1_given),
                &(local_args_info.ca1_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca1", '-',
                additional_error))
              goto failure;
          
          }
          /* contact angle of selection (using density profile).  */
          else if (strcmp (long_options[option_index].name, "ca2") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->ca2_given),
                &(local_args_info.ca2_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "ca2", '-',
                additional_error))
              goto failure;
          
          }
          /* Generalized Coordinate Number.  */
          else if (strcmp (long_options[option_index].name, "gcn") == 0)
          {
          
            if (args_info->sequentialProps_group_counter && override)
              reset_group_sequentialProps (args_info);
            args_info->sequentialProps_group_counter += 1;
          
            if (update_arg( 0 , 
                 0 , &(args_info->gcn_given),
                &(local_args_info.gcn_given), optarg, 0, 0, ARG_NO,
                check_ambiguity, override, 0, 0,
                "gcn", '-',
                additional_error))
              goto failure;
          
          }
          
          break;
        case '?':	/* Invalid option.  */
          /* `getopt_long' already printed an error message.  */
          goto failure;

        default:	/* bug: option not considered.  */
          fprintf (stderr, "%s: option unknown: %c%s\n", CMDLINE_PARSER_PACKAGE, c, (additional_error ? additional_error : ""));
          abort ();
        } /* switch */
    } /* while */

  if (args_info->sequentialProps_group_counter > 1)
    {
      fprintf (stderr, "%s: %d options of group sequentialProps were given. One is required%s.\n", argv[0], args_info->sequentialProps_group_counter, (additional_error ? additional_error : ""));
      error_occurred = 1;
    }
  


  if (check_required)
    {
      error_occurred += cmdline_parser_required2 (args_info, argv[0], additional_error);
    }

  cmdline_parser_release (&local_args_info);

  if ( error_occurred )
    return (EXIT_FAILURE);

  if (optind < argc)
    {
      int i = 0 ;
      int found_prog_name = 0;
      /* whether program name, i.e., argv[0], is in the remaining args
         (this may happen with some implementations of getopt,
          but surely not with the one included by gengetopt) */


      args_info->inputs_num = argc - optind - found_prog_name;
      args_info->inputs =
        (char **)(malloc ((args_info->inputs_num)*sizeof(char *))) ;
      while (optind < argc)
        args_info->inputs[ i++ ] = gengetopt_strdup (argv[optind++]) ;
    }

  return 0;

failure:
  
  cmdline_parser_release (&local_args_info);
  return (EXIT_FAILURE);
}